

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O0

int ExUtilInitCommandLineArguments(int argc,char **argv,CommandLineArguments *args)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  int *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  char sep [7];
  char *cur;
  undefined1 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffd9;
  undefined2 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffdf;
  WebPData *in_stack_ffffffffffffffe0;
  int local_8;
  
  if ((in_RDX == (int *)0x0) || (in_RSI == (undefined8 *)0x0)) {
    return 0;
  }
  ResetCommandLineArguments
            ((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
             (char **)CONCAT17(in_stack_ffffffffffffffdf,
                               CONCAT25(in_stack_ffffffffffffffdd,
                                        CONCAT41(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8
                                                ))),(CommandLineArguments *)0x108962);
  if ((in_EDI == 1) && (*(char *)*in_RSI != '-')) {
    iVar1 = ExUtilReadFileToWebPData((char *)in_RDX,in_stack_ffffffffffffffe0);
    if (iVar1 == 0) {
      return 0;
    }
    in_RDX[8] = 1;
    pvVar2 = WebPMalloc(0x1089df);
    *(void **)(in_RDX + 2) = pvVar2;
    if (*(long *)(in_RDX + 2) == 0) {
      ExUtilDeleteCommandLineArguments((CommandLineArguments *)0x108a01);
      return 0;
    }
    local_8 = 0;
    pcVar3 = strtok(*(char **)(in_RDX + 4),&stack0xffffffffffffffd9);
    while (pcVar3 != (char *)0x0) {
      if (local_8 == 0x4000) {
        fprintf(stderr,"ERROR: Arguments limit %d reached\n",0x4000);
        ExUtilDeleteCommandLineArguments((CommandLineArguments *)0x108a67);
        return 0;
      }
      *(char **)(*(long *)(in_RDX + 2) + (long)local_8 * 8) = pcVar3;
      pcVar3 = strtok((char *)0x0,&stack0xffffffffffffffd9);
      local_8 = local_8 + 1;
    }
    *in_RDX = local_8;
  }
  return 1;
}

Assistant:

int ExUtilInitCommandLineArguments(int argc, const char* argv[],
                                   CommandLineArguments* const args) {
  if (args == NULL || argv == NULL) return 0;
  ResetCommandLineArguments(argc, argv, args);
  if (argc == 1 && argv[0][0] != '-') {
    char* cur;
    const char sep[] = " \t\r\n\f\v";

#if defined(_WIN32) && defined(_UNICODE)
    fprintf(stderr,
            "Error: Reading arguments from a file is a feature unavailable "
            "with Unicode binaries.\n");
    return 0;
#endif

    if (!ExUtilReadFileToWebPData(argv[0], &args->argv_data)) {
      return 0;
    }
    args->own_argv = 1;
    args->argv = (const char**)WebPMalloc(MAX_ARGC * sizeof(*args->argv));
    if (args->argv == NULL) {
      ExUtilDeleteCommandLineArguments(args);
      return 0;
    }

    argc = 0;
    for (cur = strtok((char*)args->argv_data.bytes, sep);
         cur != NULL;
         cur = strtok(NULL, sep)) {
      if (argc == MAX_ARGC) {
        fprintf(stderr, "ERROR: Arguments limit %d reached\n", MAX_ARGC);
        ExUtilDeleteCommandLineArguments(args);
        return 0;
      }
      assert(strlen(cur) != 0);
      args->argv[argc++] = cur;
    }
    args->argc = argc;
  }
  return 1;
}